

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rune.cc
# Opt level: O0

char * re2::utfrune(char *s,Rune c)

{
  int iVar1;
  int in_ESI;
  byte *in_RDI;
  int n;
  Rune r;
  long c1;
  int local_24;
  ulong local_20;
  int local_14;
  byte *local_10;
  byte *local_8;
  
  local_14 = in_ESI;
  local_10 = in_RDI;
  if (in_ESI < 0x80) {
    local_8 = (byte *)strchr((char *)in_RDI,in_ESI);
  }
  else {
    while( true ) {
      for (; local_20 = (ulong)*local_10, 0x7f < local_20; local_10 = local_10 + iVar1) {
        iVar1 = chartorune(&local_24,(char *)local_10);
        if (local_24 == local_14) {
          return (char *)local_10;
        }
      }
      if (local_20 == 0) {
        return (char *)0x0;
      }
      if (local_20 == (long)local_14) break;
      local_10 = local_10 + 1;
    }
    local_8 = local_10;
  }
  return (char *)local_8;
}

Assistant:

char*
utfrune(const char *s, Rune c)
{
	long c1;
	Rune r;
	int n;

	if(c < Runesync)		/* not part of utf sequence */
		return strchr((char*)s, c);

	for(;;) {
		c1 = *(unsigned char*)s;
		if(c1 < Runeself) {	/* one byte rune */
			if(c1 == 0)
				return 0;
			if(c1 == c)
				return (char*)s;
			s++;
			continue;
		}
		n = chartorune(&r, s);
		if(r == c)
			return (char*)s;
		s += n;
	}
	return 0;
}